

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit.cpp
# Opt level: O2

void __thiscall QLineEdit::QLineEdit(QLineEdit *this,QString *contents,QWidget *parent)

{
  QLineEditPrivate *this_00;
  
  this_00 = (QLineEditPrivate *)operator_new(0x2f8);
  QLineEditPrivate::QLineEditPrivate(this_00);
  QWidget::QWidget(&this->super_QWidget,(QWidgetPrivate *)this_00,parent,(WindowFlags)0x0);
  *(undefined ***)&this->super_QWidget = &PTR_metaObject_007ce168;
  *(undefined ***)&(this->super_QWidget).super_QPaintDevice = &PTR__QLineEdit_007ce320;
  QLineEditPrivate::init
            (*(QLineEditPrivate **)&(this->super_QWidget).field_0x8,(EVP_PKEY_CTX *)contents);
  return;
}

Assistant:

QLineEdit::QLineEdit(const QString& contents, QWidget* parent)
    : QWidget(*new QLineEditPrivate, parent, { })
{
    Q_D(QLineEdit);
    d->init(contents);
}